

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::createReaderMacroOpNode(Parser *this,Token *t,Node *applied_to)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  Node *this_00;
  Node *local_20;
  
  if (applied_to == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    local_20 = applied_to;
    this_00 = (Node *)operator_new(0x30);
    CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
    this_00->tok = t;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->nodeType = PNT_READER_MACRO;
    ppNVar2 = (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar2 == (pointer)0x0) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this_00->children,(iterator)0x0,&local_20);
    }
    else {
      *ppNVar2 = local_20;
      pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return this_00;
}

Assistant:

Node * createReaderMacroOpNode(Token & t, Node * applied_to)
  {
    if (!applied_to)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_READER_MACRO;
    n->children.push_back(applied_to);
    return n;
  }